

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
          (Id<mathiu::impl::Set> *this,Set *v)

{
  bool bVar1;
  ExprPtrSet *l;
  BlockT *pBVar2;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    l = &internalValue(this)->super_ExprPtrSet;
    bVar1 = mathiu::impl::operator==(l,&v->super_ExprPtrSet);
    return bVar1;
  }
  pBVar2 = block(this);
  IdUtil<mathiu::impl::Set>::bindValue<mathiu::impl::Set_const&>
            (&(pBVar2->super_IdBlockBase<mathiu::impl::Set>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }